

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_info_copy(LodePNGInfo *dest,LodePNGInfo *source)

{
  uint uVar1;
  uint uVar2;
  LodePNGInfo *in_RSI;
  LodePNGInfo *in_RDI;
  uint error_3;
  uint error_2;
  uint error_1;
  uint error;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_4;
  
  lodepng_info_cleanup((LodePNGInfo *)0x11a0e8);
  memcpy(in_RDI,in_RSI,0xe8);
  lodepng_color_mode_init(&in_RDI->color);
  uVar1 = lodepng_color_mode_copy
                    ((LodePNGColorMode *)in_RSI,
                     (LodePNGColorMode *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  local_4 = uVar1;
  if (((uVar1 == 0) &&
      (uVar2 = LodePNGText_copy(in_RSI,(LodePNGInfo *)(ulong)in_stack_ffffffffffffffe0),
      local_4 = uVar2, uVar2 == 0)) &&
     (local_4 = LodePNGIText_copy(in_RSI,(LodePNGInfo *)((ulong)uVar1 << 0x20)), local_4 == 0)) {
    LodePNGUnknownChunks_init(in_RDI);
    local_4 = LodePNGUnknownChunks_copy(in_RSI,(LodePNGInfo *)CONCAT44(uVar1,uVar2));
    if (local_4 == 0) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

unsigned lodepng_info_copy(LodePNGInfo* dest, const LodePNGInfo* source)
{
	lodepng_info_cleanup(dest);
	*dest = *source;
	lodepng_color_mode_init(&dest->color);
	CERROR_TRY_RETURN(lodepng_color_mode_copy(&dest->color, &source->color));

#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
	CERROR_TRY_RETURN(LodePNGText_copy(dest, source));
	CERROR_TRY_RETURN(LodePNGIText_copy(dest, source));

	LodePNGUnknownChunks_init(dest);
	CERROR_TRY_RETURN(LodePNGUnknownChunks_copy(dest, source));
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
	return 0;
}